

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::FCDUTF8CollationIterator::handleNextCE32
          (FCDUTF8CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  int32_t *pi;
  int32_t *piVar1;
  byte bVar2;
  short sVar3;
  State SVar4;
  int iVar5;
  uint8_t *s;
  UTrie2 *pUVar6;
  UBool UVar7;
  char16_t cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint32_t *puVar13;
  int iVar14;
  UErrorCode *pUVar15;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  
  pi = &(this->super_UTF8CollationIterator).pos;
  pUVar15 = errorCode;
  do {
    while (SVar4 = this->state, SVar4 == IN_NORMALIZED) {
      sVar3 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar9 = (this->normalized).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar3 >> 5;
      }
      iVar14 = (this->super_UTF8CollationIterator).pos;
      if (iVar14 != iVar9) {
        (this->super_UTF8CollationIterator).pos = iVar14 + 1;
        cVar8 = UnicodeString::doCharAt(&this->normalized,iVar14);
        uVar11 = (uint)(ushort)cVar8;
        *c = uVar11;
        goto LAB_00222153;
      }
LAB_0022200a:
      switchToForward(this);
      pUVar15 = extraout_RDX;
    }
    if (SVar4 == IN_FCD_SEGMENT) {
      if ((this->super_UTF8CollationIterator).pos != this->limit) {
        uVar12 = UTF8CollationIterator::handleNextCE32(&this->super_UTF8CollationIterator,c,pUVar15)
        ;
        return uVar12;
      }
      goto LAB_0022200a;
    }
    if (SVar4 != CHECK_FWD) goto LAB_0022200a;
    iVar9 = (this->super_UTF8CollationIterator).pos;
    if (iVar9 == (this->super_UTF8CollationIterator).length) break;
    s = (this->super_UTF8CollationIterator).u8;
    (this->super_UTF8CollationIterator).pos = iVar9 + 1;
    bVar2 = s[iVar9];
    uVar11 = (uint)bVar2;
    *c = uVar11;
    if (-1 < (char)bVar2) {
      puVar13 = ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32;
      goto LAB_0022217c;
    }
    uVar11 = (uint)bVar2;
    iVar9 = (this->super_UTF8CollationIterator).length;
    iVar14 = -3;
    if ((bVar2 & 0xf0) == 0xe0) {
      iVar5 = *pi;
      if (iVar9 <= iVar5 + 1 && -1 < iVar9) goto LAB_00222093;
      if ((((byte)" 000000000000\x1000"[uVar11 & 0xf] >> (s[iVar5] >> 5) & 1) == 0) ||
         (0x3f < (byte)(s[(long)iVar5 + 1] ^ 0x80))) goto LAB_00222093;
      *c = (s[iVar5] & 0x3f) << 6 | (uVar11 & 0xf) << 0xc | s[(long)iVar5 + 1] ^ 0x80;
      *pi = *pi + 2;
      UVar7 = CollationFCD::hasTccc(*c);
      uVar11 = *c;
      if (UVar7 == '\0') {
LAB_00222153:
        pUVar6 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
        puVar13 = pUVar6->data32;
        uVar11 = (uVar11 & 0x1f) + (uint)pUVar6->index[(int)uVar11 >> 5] * 4;
LAB_0022217c:
        return puVar13[uVar11];
      }
      if ((uVar11 & 0x1fff01) != 0xf01) {
        if ((this->super_UTF8CollationIterator).pos != (this->super_UTF8CollationIterator).length) {
          UVar7 = nextHasLccc(this);
          if (UVar7 != '\0') goto LAB_002220dd;
          uVar11 = *c;
        }
        goto LAB_00222153;
      }
    }
    else {
      if ((((byte)(bVar2 + 0x3e) < 0x1e) && (*pi != iVar9)) &&
         (uVar10 = s[*pi] ^ 0x80, (byte)uVar10 < 0x40)) {
        pUVar6 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
        uVar12 = pUVar6->data32[pUVar6->index[(ulong)bVar2 + 0x760] + uVar10];
        *c = (uVar11 & 0x1f) << 6 | uVar10;
        piVar1 = &(this->super_UTF8CollationIterator).pos;
        *piVar1 = *piVar1 + 1;
        UVar7 = CollationFCD::hasTccc(*c);
        if (UVar7 == '\0') {
          return uVar12;
        }
        if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) {
          return uVar12;
        }
        UVar7 = nextHasLccc(this);
        iVar14 = -2;
        if (UVar7 == '\0') {
          return uVar12;
        }
        goto LAB_002220dd;
      }
LAB_00222093:
      uVar11 = utf8_nextCharSafeBody_63(s,pi,iVar9,uVar11,-3);
      *c = uVar11;
      if (uVar11 == 0xfffd) {
        return 0xfffd0505;
      }
      UVar7 = CollationFCD::hasTccc((uVar11 >> 10) + 0xd7c0 & 0xffff);
      if ((UVar7 == '\0') ||
         ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length)) {
LAB_00222105:
        uVar12 = CollationData::getCE32FromSupplementary
                           ((this->super_UTF8CollationIterator).super_CollationIterator.data,*c);
        return uVar12;
      }
      UVar7 = nextHasLccc(this);
      iVar14 = -4;
      if (UVar7 == '\0') goto LAB_00222105;
    }
LAB_002220dd:
    piVar1 = &(this->super_UTF8CollationIterator).pos;
    *piVar1 = *piVar1 + iVar14;
    UVar7 = nextSegment(this,errorCode);
    pUVar15 = extraout_RDX_00;
  } while (UVar7 != '\0');
  *c = -1;
  return 0xc0;
}

Assistant:

uint32_t
FCDUTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == CHECK_FWD) {
            // Combination of UTF8CollationIterator::handleNextCE32() with FCD check fastpath.
            if(pos == length) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = u8[pos++];
            if(U8_IS_SINGLE(c)) {
                // ASCII 00..7F
                return trie->data32[c];
            }
            uint8_t t1, t2;
            if(0xe0 <= c && c < 0xf0 &&
                    ((pos + 1) < length || length < 0) &&
                    U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
                    (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
                // U+0800..U+FFFF except surrogates
                c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
                pos += 2;
                if(CollationFCD::hasTccc(c) &&
                        (CollationFCD::maybeTibetanCompositeVowel(c) ||
                            (pos != length && nextHasLccc()))) {
                    pos -= 3;
                } else {
                    break;  // return CE32(BMP)
                }
            } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
                // U+0080..U+07FF
                uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
                c = ((c & 0x1f) << 6) | t1;
                ++pos;
                if(CollationFCD::hasTccc(c) && pos != length && nextHasLccc()) {
                    pos -= 2;
                } else {
                    return ce32;
                }
            } else {
                // Function call for supplementary code points and error cases.
                // Illegal byte sequences yield U+FFFD.
                c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
                if(c == 0xfffd) {
                    return Collation::FFFD_CE32;
                } else {
                    U_ASSERT(c > 0xffff);
                    if(CollationFCD::hasTccc(U16_LEAD(c)) && pos != length && nextHasLccc()) {
                        pos -= 4;
                    } else {
                        return data->getCE32FromSupplementary(c);
                    }
                }
            }
            if(!nextSegment(errorCode)) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            continue;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            return UTF8CollationIterator::handleNextCE32(c, errorCode);
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}